

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

int __thiscall Catch::Session::runInternal(Session *this)

{
  long lVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  _func_int **pp_Var2;
  pointer psVar3;
  element_type *peVar4;
  tuple<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tVar5;
  undefined8 *puVar6;
  undefined8 uVar7;
  pointer pFVar8;
  ulong uVar9;
  int iVar10;
  Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
  *pSVar11;
  undefined4 extraout_var;
  long *plVar12;
  long lVar13;
  element_type *peVar14;
  undefined4 extraout_var_00;
  IStreamingReporter *pIVar15;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams> *pSVar16;
  size_t sVar17;
  undefined4 extraout_var_05;
  char *pcVar18;
  ostream *poVar19;
  SpecialProperties SVar20;
  int iVar21;
  const_iterator __begin1;
  pointer pFVar22;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> _Var23;
  const_iterator __end1;
  undefined8 *puVar24;
  shared_ptr<Catch::TestSpec::Pattern> *pattern;
  undefined8 *puVar25;
  pointer psVar26;
  TestCase *testCase;
  shared_ptr<Catch::Config> *psVar27;
  pointer *__x;
  bool bVar28;
  undefined1 auVar29 [12];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tags;
  Totals totals;
  ReusableStringStream testConfig;
  TestSpec testSpec;
  string filename;
  size_t local_320;
  size_t local_318;
  size_t local_310;
  size_t local_308;
  size_t local_300;
  undefined1 local_2f8 [16];
  undefined1 local_2e8 [48];
  undefined8 *local_2b8;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_2b0;
  Totals local_2a8;
  TestCase *local_270;
  ReusableStringStream local_268;
  vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> local_258;
  undefined1 local_240 [240];
  element_type *local_150;
  ulong local_130;
  _Head_base<0UL,_Catch::IStreamingReporter_*,_false> local_108;
  
  iVar10 = 1;
  if (((this->m_startupExceptions == false) && (iVar10 = 0, (this->m_configData).showHelp == false))
     && ((this->m_configData).libIdentify == false)) {
    config(this);
    seedRng(&((this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
             ->super_IConfig);
    local_2e8._40_8_ = &this->m_config;
    if ((this->m_configData).filenamesAsTags == true) {
      peVar14 = (((shared_ptr<Catch::Config> *)local_2e8._40_8_)->
                super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      pSVar11 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                ::getInternal();
      iVar10 = (*(pSVar11->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar11);
      plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var,iVar10) + 0x18))
                                  ((long *)CONCAT44(extraout_var,iVar10),peVar14);
      lVar1 = plVar12[1];
      if (*plVar12 != lVar1) {
        __x = (pointer *)(*plVar12 + 0x60);
        do {
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2f8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)__x);
          std::__cxx11::string::string
                    ((string *)local_240,
                     (char *)(((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)(__x + 6))->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start,(allocator *)&local_258);
          lVar13 = std::__cxx11::string::find_last_of((char *)local_240,0x16c775,0xffffffffffffffff)
          ;
          if (lVar13 != -1) {
            std::__cxx11::string::erase((ulong)local_240,0);
            *(char *)local_240._0_8_ = '#';
          }
          peVar14 = (element_type *)
                    std::__cxx11::string::rfind
                              ((char)(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)local_240,0x2e);
          if (peVar14 != (element_type *)0xffffffffffffffff) {
            if ((ulong)local_240._8_8_ < peVar14) {
              auVar29 = std::__throw_out_of_range_fmt
                                  ("%s: __pos (which is %zu) > this->size() (which is %zu)",
                                   "basic_string::erase",peVar14);
              if (local_2f8._0_8_ != (long)local_2f8 + 0x10) {
                operator_delete((void *)local_2f8._0_8_);
              }
              ReusableStringStream::~ReusableStringStream(&local_268);
              clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
              ::~vector(&local_258);
              RunContext::~RunContext((RunContext *)local_240);
              if (local_2b0._M_head_impl != (IStreamingReporter *)0x0) {
                (*(local_2b0._M_head_impl)->_vptr_IStreamingReporter[1])();
              }
              if (auVar29._8_4_ == 1) {
                plVar12 = (long *)__cxa_begin_catch(auVar29._0_8_);
                pcVar18 = (char *)(**(code **)(*plVar12 + 0x10))(plVar12);
                poVar19 = std::operator<<((ostream *)&std::cerr,pcVar18);
                std::endl<char,std::char_traits<char>>(poVar19);
                __cxa_end_catch();
                return 0xff;
              }
              _Unwind_Resume(auVar29._0_8_);
            }
            *(char *)(local_240._0_8_ + (long)peVar14) = '\0';
            local_240._8_8_ = peVar14;
          }
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_2f8,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_240)
          ;
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&local_2a8,
                   (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_2f8);
          setTags((TestCaseInfo *)(__x + -0xc),
                  (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_2a8);
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2a8);
          if ((undefined1 *)local_240._0_8_ != local_240 + 0x10) {
            operator_delete((void *)local_240._0_8_);
          }
          clara::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_2f8);
          lVar13 = (long)(__x + 0xb);
          __x = __x + 0x17;
        } while (lVar13 != lVar1);
      }
    }
    list((Catch *)local_240,(shared_ptr<Catch::Config> *)local_2e8._40_8_);
    if ((int *)local_240._0_8_ == (int *)0x0) {
      pSVar11 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                ::getInternal();
      iVar10 = (*(pSVar11->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar11);
      plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_00,iVar10) + 0x20))
                                  ((long *)CONCAT44(extraout_var_00,iVar10));
      if (*plVar12 == plVar12[1]) {
        local_240._0_8_ =
             (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_240._8_8_ =
             (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count + 1
            ;
          }
        }
        anon_unknown_1::createReporter
                  ((anon_unknown_1 *)&local_2b0,
                   &(((element_type *)local_240._0_8_)->m_data).reporterName,(IConfigPtr *)local_240
                  );
      }
      else {
        pIVar15 = (IStreamingReporter *)operator_new(0x30);
        pIVar15->_vptr_IStreamingReporter = (_func_int **)&PTR__ListeningReporter_00193ed8;
        pIVar15[1]._vptr_IStreamingReporter = (_func_int **)0x0;
        pIVar15[2]._vptr_IStreamingReporter = (_func_int **)0x0;
        pIVar15[3]._vptr_IStreamingReporter = (_func_int **)0x0;
        pIVar15[4]._vptr_IStreamingReporter = (_func_int **)0x0;
        *(undefined2 *)&pIVar15[5]._vptr_IStreamingReporter = 0x100;
        local_2b0._M_head_impl = pIVar15;
        pSVar11 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                  ::getInternal();
        iVar10 = (*(pSVar11->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[2])(pSVar11);
        plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_01,iVar10) + 0x20))
                                    ((long *)CONCAT44(extraout_var_01,iVar10));
        puVar25 = (undefined8 *)*plVar12;
        local_2b8 = (undefined8 *)plVar12[1];
        if (puVar25 != local_2b8) {
          do {
            plVar12 = (long *)*puVar25;
            peVar14 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr;
            this_00 = (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>
                      ._M_refcount._M_pi;
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            iVar10 = (*(peVar14->super_IConfig).super_NonCopyable._vptr_NonCopyable[3])(peVar14);
            local_240._0_8_ = CONCAT44(extraout_var_02,iVar10);
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              if (__libc_single_threaded == '\0') {
                LOCK();
                this_00->_M_use_count = this_00->_M_use_count + 1;
                UNLOCK();
              }
              else {
                this_00->_M_use_count = this_00->_M_use_count + 1;
              }
            }
            local_240._8_8_ = peVar14;
            local_240._16_8_ = this_00;
            (**(code **)(*plVar12 + 0x10))
                      ((unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                        *)local_2f8,plVar12,local_240);
            std::
            vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
            ::
            emplace_back<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>
                      ((vector<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>,std::allocator<std::unique_ptr<Catch::IStreamingReporter,std::default_delete<Catch::IStreamingReporter>>>>
                        *)(pIVar15 + 1),
                       (unique_ptr<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
                        *)local_2f8);
            if ((_Head_base<0UL,_Catch::IStreamingReporter_*,_false>)local_2f8._0_8_ !=
                (_Head_base<0UL,_Catch::IStreamingReporter_*,_false>)0x0) {
              (*(*(_func_int ***)local_2f8._0_8_)[1])();
            }
            local_2f8._0_8_ = (IStreamingReporter *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._16_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._16_8_);
            }
            if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            }
            puVar25 = puVar25 + 2;
          } while (puVar25 != local_2b8);
        }
        local_240._0_8_ =
             (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_240._8_8_ =
             (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count + 1
            ;
            UNLOCK();
          }
          else {
            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count =
                 ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_)->_M_use_count + 1
            ;
          }
        }
        anon_unknown_1::createReporter
                  ((anon_unknown_1 *)local_2f8,
                   &(((element_type *)local_240._0_8_)->m_data).reporterName,(IConfigPtr *)local_240
                  );
        _Var23._M_head_impl = (IStreamingReporter *)local_2f8._0_8_;
        local_2f8._0_8_ = (IStreamingReporter *)0x0;
        pp_Var2 = pIVar15[4]._vptr_IStreamingReporter;
        pIVar15[4]._vptr_IStreamingReporter = (_func_int **)_Var23._M_head_impl;
        if (pp_Var2 != (_func_int **)0x0) {
          (**(code **)(*pp_Var2 + 8))(pp_Var2);
          _Var23._M_head_impl = (IStreamingReporter *)pIVar15[4]._vptr_IStreamingReporter;
        }
        iVar10 = (*(_Var23._M_head_impl)->_vptr_IStreamingReporter[2])();
        *(byte *)&pIVar15[5]._vptr_IStreamingReporter = (byte)iVar10 & 1;
        if ((_Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
             )local_2f8._0_8_ != (IStreamingReporter *)0x0) {
          (**(code **)(*(long *)local_2f8._0_8_ + 8))();
        }
        local_2f8._0_8_ =
             (__uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
              )0x0;
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_240._8_8_);
      }
      uVar7 = local_2e8._40_8_;
      local_2f8._0_8_ =
           (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      local_2f8._8_8_ =
           (this->m_config).super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_)->_M_use_count + 1;
          UNLOCK();
        }
        else {
          ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_)->_M_use_count =
               ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_)->_M_use_count + 1;
        }
      }
      RunContext::RunContext
                ((RunContext *)local_240,(IConfigPtr *)local_2f8,(IStreamingReporterPtr *)&local_2b0
                );
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        clara::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_2f8._8_8_);
      }
      local_2a8.error = 0;
      local_2a8.assertions.passed = 0;
      local_2a8.assertions.failed = 0;
      local_2a8.assertions.failedButOk = 0;
      local_2a8.testCases.passed = 0;
      local_2a8.testCases.failed = 0;
      local_2a8.testCases.failedButOk = 0;
      (*(((__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *)uVar7)->_M_ptr->super_IConfig).
        super_NonCopyable._vptr_NonCopyable[4])(local_2f8);
      RunContext::testGroupStarting((RunContext *)local_240,(string *)local_2f8,1,1);
      if ((element_type *)local_2f8._0_8_ != (element_type *)(local_2f8 + 0x10)) {
        operator_delete((void *)local_2f8._0_8_);
      }
      iVar10 = (*(((__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *)uVar7)->_M_ptr->
                 super_IConfig).super_NonCopyable._vptr_NonCopyable[0xc])();
      clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::vector
                (&local_258,
                 (vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_> *)
                 CONCAT44(extraout_var_03,iVar10));
      peVar14 = ((__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *)uVar7)->_M_ptr;
      pSVar11 = Singleton<Catch::(anonymous_namespace)::RegistryHub,_Catch::IRegistryHub,_Catch::IMutableRegistryHub>
                ::getInternal();
      iVar10 = (*(pSVar11->super_RegistryHub).super_IRegistryHub._vptr_IRegistryHub[3])(pSVar11);
      plVar12 = (long *)(**(code **)(*(long *)CONCAT44(extraout_var_04,iVar10) + 0x18))
                                  ((long *)CONCAT44(extraout_var_04,iVar10),peVar14);
      testCase = (TestCase *)*plVar12;
      local_270 = (TestCase *)plVar12[1];
      if (testCase == local_270) {
        puVar25 = (undefined8 *)0x0;
        local_318 = 0;
        local_320 = 0;
        local_310 = 0;
      }
      else {
        local_318 = 0;
        local_320 = 0;
        local_310 = 0;
        local_300 = 0;
        puVar25 = (undefined8 *)0x0;
        local_308 = 0;
        do {
          pFVar8 = local_258.
                   super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
          if (local_258.
              super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
              _M_impl.super__Vector_impl_data._M_start ==
              local_258.
              super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>.
              _M_impl.super__Vector_impl_data._M_finish) {
            SVar20 = IsHidden;
LAB_00124db6:
            bVar28 = ((testCase->super_TestCaseInfo).properties & SVar20) == None;
          }
          else {
            peVar14 = ((__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *)local_2e8._40_8_)
                      ->_M_ptr;
            pFVar22 = local_258.
                      super__Vector_base<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            local_2b8 = puVar25;
            do {
              psVar26 = (pFVar22->m_patterns).
                        super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
                        ._M_impl.super__Vector_impl_data._M_start;
              psVar3 = (pFVar22->m_patterns).
                       super__Vector_base<std::shared_ptr<Catch::TestSpec::Pattern>,_std::allocator<std::shared_ptr<Catch::TestSpec::Pattern>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              while( true ) {
                puVar25 = local_2b8;
                if (psVar26 == psVar3) {
                  iVar10 = (*(peVar14->super_IConfig).super_NonCopyable._vptr_NonCopyable[2])
                                     (peVar14);
                  SVar20 = Throws;
                  bVar28 = true;
                  if ((char)iVar10 == '\0') goto LAB_00124db6;
                  goto LAB_00124dc0;
                }
                peVar4 = (psVar26->
                         super___shared_ptr<Catch::TestSpec::Pattern,_(__gnu_cxx::_Lock_policy)2>).
                         _M_ptr;
                iVar10 = (*peVar4->_vptr_Pattern[2])(peVar4,testCase);
                if ((char)iVar10 == '\0') break;
                psVar26 = psVar26 + 1;
              }
              pFVar22 = pFVar22 + 1;
            } while (pFVar22 != pFVar8);
            bVar28 = false;
            puVar25 = local_2b8;
          }
LAB_00124dc0:
          uVar9 = local_130;
          iVar10 = (*(local_150->super_NonCopyable)._vptr_NonCopyable[9])();
          if ((bool)(bVar28 ^ 1) || (ulong)(long)iVar10 <= uVar9) {
            (*(local_108._M_head_impl)->_vptr_IStreamingReporter[0x10])
                      (local_108._M_head_impl,testCase);
          }
          else {
            RunContext::runTest((Totals *)local_2f8,(RunContext *)local_240,testCase);
            local_308 = (long)(_func_int ***)local_2f8._8_8_ + local_308;
            puVar25 = (undefined8 *)((long)puVar25 + local_2e8._0_8_);
            local_300 = local_300 + local_2e8._8_8_;
            local_310 = local_310 + local_2e8._16_8_;
            local_320 = local_320 + local_2e8._24_8_;
            local_318 = local_318 + local_2e8._32_8_;
          }
          testCase = testCase + 1;
        } while (testCase != local_270);
        local_2a8.assertions.passed = local_308;
        local_2a8.assertions.failedButOk = local_300;
        local_2a8.testCases.passed = local_310;
        local_2a8.testCases.failed = local_320;
        local_2a8.testCases.failedButOk = local_318;
        local_2a8.assertions.failed = (size_t)puVar25;
      }
      psVar27 = (shared_ptr<Catch::Config> *)local_2e8._40_8_;
      iVar10 = (*(((__shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2> *)local_2e8._40_8_)->
                  _M_ptr->super_IConfig).super_NonCopyable._vptr_NonCopyable[8])();
      iVar21 = 0;
      if (((char)iVar10 != '\0') && (iVar21 = 0, local_310 + local_320 + local_318 == 0)) {
        pSVar16 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
                  getInternal();
        sVar17 = StringStreams::add(&pSVar16->super_StringStreams);
        local_268.m_index = sVar17;
        pSVar16 = Singleton<Catch::StringStreams,_Catch::StringStreams,_Catch::StringStreams>::
                  getInternal();
        tVar5.
        super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl =
             *(_Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&(pSVar16->super_StringStreams).m_streams.
                  super__Vector_base<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unique_ptr<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[sVar17]._M_t.
                  super___uniq_ptr_impl<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ;
        local_268.m_oss =
             (ostream *)
             tVar5.
             super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
        iVar10 = (*(((psVar27->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr
                    )->super_IConfig).super_NonCopyable._vptr_NonCopyable[0xe])();
        puVar24 = *(undefined8 **)CONCAT44(extraout_var_05,iVar10);
        puVar6 = (undefined8 *)((long *)CONCAT44(extraout_var_05,iVar10))[1];
        if (puVar24 != puVar6) {
          bVar28 = true;
          do {
            if (!bVar28) {
              local_2f8[0] = 0x20;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)
                         tVar5.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl,local_2f8,1);
            }
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)
                       tVar5.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl,(char *)*puVar24,puVar24[1]);
            puVar24 = puVar24 + 4;
            bVar28 = false;
          } while (puVar24 != puVar6);
        }
        std::__cxx11::stringbuf::str();
        (*(local_108._M_head_impl)->_vptr_IStreamingReporter[3])(local_108._M_head_impl,local_2f8);
        psVar27 = (shared_ptr<Catch::Config> *)local_2e8._40_8_;
        if ((element_type *)local_2f8._0_8_ != (element_type *)(local_2f8 + 0x10)) {
          operator_delete((void *)local_2f8._0_8_);
        }
        local_2a8.error = -1;
        ReusableStringStream::~ReusableStringStream(&local_268);
        iVar21 = -1;
      }
      (*(((psVar27->super___shared_ptr<Catch::Config,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        super_IConfig).super_NonCopyable._vptr_NonCopyable[4])(local_2f8);
      RunContext::testGroupEnded((RunContext *)local_240,(string *)local_2f8,&local_2a8,1,1);
      if ((element_type *)local_2f8._0_8_ != (element_type *)(local_2f8 + 0x10)) {
        operator_delete((void *)local_2f8._0_8_);
      }
      clara::std::vector<Catch::TestSpec::Filter,_std::allocator<Catch::TestSpec::Filter>_>::~vector
                (&local_258);
      RunContext::~RunContext((RunContext *)local_240);
      if (local_2b0._M_head_impl != (IStreamingReporter *)0x0) {
        (*(local_2b0._M_head_impl)->_vptr_IStreamingReporter[1])();
      }
      iVar10 = (int)puVar25;
      if ((int)puVar25 < iVar21) {
        iVar10 = iVar21;
      }
      if (0xfe < iVar10) {
        iVar10 = 0xff;
      }
    }
    else {
      iVar10 = *(int *)local_240._0_8_;
    }
  }
  return iVar10;
}

Assistant:

int Session::runInternal() {
        if( m_startupExceptions )
            return 1;

        if (m_configData.showHelp || m_configData.libIdentify) {
            return 0;
        }

        CATCH_TRY {
            config(); // Force config to be constructed

            seedRng( *m_config );

            if( m_configData.filenamesAsTags )
                applyFilenamesAsTags( *m_config );

            // Handle list request
            if( Option<std::size_t> listed = list( m_config ) )
                return static_cast<int>( *listed );

            auto totals = runTests( m_config );
            // Note that on unices only the lower 8 bits are usually used, clamping
            // the return value to 255 prevents false negative when some multiple
            // of 256 tests has failed
            return (std::min) (MaxExitCode, (std::max) (totals.error, static_cast<int>(totals.assertions.failed)));
        }